

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::NotImplementedException::NotImplementedException<std::__cxx11::string,int>
          (NotImplementedException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,int params_1)

{
  pointer pcVar1;
  int in_R8D;
  string local_68;
  string local_48;
  
  pcVar1 = (params->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + params->_M_string_length);
  Exception::ConstructMessage<std::__cxx11::string,int>
            (&local_48,(Exception *)msg,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(uint)params_1,in_R8D);
  NotImplementedException(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}